

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint ON_SubDEdgeSharpness::SetEdgeChainSharpness
               (ON_Interval chain_sharpness_range,uint edge_count,
               ON_SimpleArray<ON_SubDEdgeSharpness> *chain_edge_sharpness)

{
  uint uVar1;
  ON_SubDEdgeSharpness *in_RDX;
  ON_SubDEdgeSharpness *extraout_RDX;
  
  uVar1 = 0;
  if (1 < edge_count + 1) {
    if ((ulong)(long)chain_edge_sharpness->m_capacity < (ulong)edge_count) {
      ON_SimpleArray<ON_SubDEdgeSharpness>::SetCapacity(chain_edge_sharpness,(ulong)edge_count);
      in_RDX = extraout_RDX;
    }
    if ((-1 < (int)edge_count) && ((int)edge_count <= chain_edge_sharpness->m_capacity)) {
      chain_edge_sharpness->m_count = edge_count;
    }
    uVar1 = SetEdgeChainSharpness
                      ((ON_SubDEdgeSharpness *)(ulong)edge_count,chain_sharpness_range,
                       (uint)chain_edge_sharpness->m_a,in_RDX);
    if ((uVar1 == 0) && (-1 < chain_edge_sharpness->m_capacity)) {
      chain_edge_sharpness->m_count = 0;
    }
  }
  return uVar1;
}

Assistant:

unsigned ON_SubDEdgeSharpness::SetEdgeChainSharpness(
  ON_Interval chain_sharpness_range,
  unsigned edge_count,
  ON_SimpleArray<ON_SubDEdgeSharpness>& chain_edge_sharpness
)
{
  if (edge_count <= 0 || edge_count >= ON_UNSET_UINT_INDEX)
    return 0;
  chain_edge_sharpness.Reserve(edge_count);
  chain_edge_sharpness.SetCount(edge_count);
  const unsigned rc = ON_SubDEdgeSharpness::SetEdgeChainSharpness(chain_sharpness_range, edge_count, chain_edge_sharpness.Array());
  if (rc <= 0)
    chain_edge_sharpness.SetCount(0);
  return rc;
}